

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void __thiscall QList<QByteArray>::removeAt(QList<QByteArray> *this,qsizetype i)

{
  Data *pDVar1;
  
  pDVar1 = (this->d).d;
  if ((pDVar1 == (Data *)0x0) ||
     (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QArrayDataPointer<QByteArray>::reallocateAndGrow
              (&this->d,GrowsAtEnd,0,(QArrayDataPointer<QByteArray> *)0x0);
  }
  QtPrivate::QMovableArrayOps<QByteArray>::erase
            ((QMovableArrayOps<QByteArray> *)this,(this->d).ptr + i,1);
  return;
}

Assistant:

void removeAt(qsizetype i) { remove(i); }